

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void * c4::aalloc(size_t sz,size_t alignment)

{
  code *pcVar1;
  bool bVar2;
  void *pvVar3;
  
  if (detail::s_aalloc != (undefined *)0x0) {
    pvVar3 = (void *)(*(code *)detail::s_aalloc)(sz,alignment);
    return pvVar3;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar2 = is_debugger_attached();
    if (bVar2) {
      pcVar1 = (code *)swi(3);
      pvVar3 = (void *)(*pcVar1)();
      return pvVar3;
    }
  }
  handle_error(0x1fa4cf,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x4417);
}

Assistant:

void* aalloc(size_t sz, size_t alignment)
{
    C4_ASSERT_MSG(c4::get_aalloc() != nullptr, "did you forget to call set_aalloc()?");
    auto fn = c4::get_aalloc();
    void* ptr = fn(sz, alignment);
    return ptr;
}